

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O3

void xc_hyb_gga_xc_apf_init(xc_func_type *p)

{
  int funcs_id [6];
  int local_58 [8];
  double local_38 [6];
  
  local_58[0] = 1;
  local_58[1] = 0x6a;
  local_58[2] = 0xc;
  local_58[3] = 0x86;
  local_58[4] = 0x65;
  local_58[5] = 0x82;
  local_38[0] = 0.03288000000000003;
  local_38[1] = 0.29591999999999996;
  local_38[2] = 0.07808999999999998;
  local_38[3] = 0.33291;
  local_38[4] = 0.44175;
  local_38[5] = 0.589;
  xc_mix_init(p,6,local_58,local_38);
  xc_hyb_init_hybrid(p,0.22945);
  return;
}

Assistant:

void
xc_hyb_gga_xc_apf_init(xc_func_type *p)
{
  /* Functional is 41.1% B3PW91 and 58.9% PBE0 */
  const double fb3pw91 = 0.411;
  const double fpbe0   = 1.0 - fb3pw91;

  /* Exact exchange in B3PW91 and PBE0 */
  const double xb3pw91 = 0.20;
  const double xpbe0   = 0.25;

  int funcs_id [6] = {XC_LDA_X, XC_GGA_X_B88, XC_LDA_C_PW, XC_GGA_C_PW91, XC_GGA_X_PBE, XC_GGA_C_PBE};

  /* Used C standard doesn't allow initializer list, even with const
     variables */
  double funcs_coef[6];
  funcs_coef[0]=(1.0 - xb3pw91 - 0.72)*fb3pw91;
  funcs_coef[1]=0.72*fb3pw91;
  funcs_coef[2]=(1.0 - 0.81)*fb3pw91;
  funcs_coef[3]=0.81*fb3pw91;
  funcs_coef[4]=(1.0 - xpbe0)*fpbe0;
  funcs_coef[5]=fpbe0;

  xc_mix_init(p, 6, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, fb3pw91*xb3pw91 + fpbe0*xpbe0);
}